

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmPre.c
# Opt level: O2

int Ifd_ManFindDsd(Ifd_Man_t *pMan,char *p)

{
  int iVar1;
  char *p_local;
  
  if (*p == '1') {
    if (p[1] == '\0') {
      iVar1 = 1;
      goto LAB_0036cedc;
    }
  }
  else if ((*p == '0') && (p[1] == '\0')) {
    iVar1 = 0;
    goto LAB_0036cedc;
  }
  p_local = p;
  Ifd_ManComputeMatches(p);
  iVar1 = Ifd_ManFindDsd_rec(pMan,p,&p_local,Ifd_ManComputeMatches::pMatches);
  p = p_local;
LAB_0036cedc:
  p_local = p + 1;
  if (p[1] == '\0') {
    return iVar1;
  }
  __assert_fail("*++p == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mpm/mpmPre.c"
                ,0x250,"int Ifd_ManFindDsd(Ifd_Man_t *, char *)");
}

Assistant:

int Ifd_ManFindDsd( Ifd_Man_t * pMan, char * p )
{
    int Res;
    if ( *p == '0' && *(p+1) == 0 )
        Res = 0;
    else if ( *p == '1' && *(p+1) == 0 )
        Res = 1;
    else
        Res = Ifd_ManFindDsd_rec( pMan, p, &p, Ifd_ManComputeMatches(p) );
    assert( *++p == 0 );
    return Res;
}